

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QGenericArrayOps<QCss::Symbol>::copyAppend
          (QGenericArrayOps<QCss::Symbol> *this,Symbol *b,Symbol *e)

{
  qsizetype *pqVar1;
  Symbol *pSVar2;
  long lVar3;
  Data *pDVar4;
  int iVar5;
  
  if ((b != e) && (b < e)) {
    pSVar2 = (this->super_QArrayDataPointer<QCss::Symbol>).ptr;
    do {
      lVar3 = (this->super_QArrayDataPointer<QCss::Symbol>).size;
      pSVar2[lVar3].token = b->token;
      pDVar4 = (b->text).d.d;
      pSVar2[lVar3].text.d.d = pDVar4;
      pSVar2[lVar3].text.d.ptr = (b->text).d.ptr;
      pSVar2[lVar3].text.d.size = (b->text).d.size;
      if (pDVar4 != (Data *)0x0) {
        LOCK();
        (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      iVar5 = b->len;
      pSVar2[lVar3].start = b->start;
      pSVar2[lVar3].len = iVar5;
      b = b + 1;
      pqVar1 = &(this->super_QArrayDataPointer<QCss::Symbol>).size;
      *pqVar1 = *pqVar1 + 1;
    } while (b < e);
  }
  return;
}

Assistant:

void copyAppend(const T *b, const T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e) // short-cut and handling the case b and e == nullptr
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(*b);
            ++b;
            ++this->size;
        }
    }